

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void * __thiscall mpt::array::insert(array *this,size_t off,size_t len,void *data)

{
  content *pcVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  void *pvVar6;
  
  pcVar1 = (this->_buf)._ref;
  if ((pcVar1 == (content *)0x0) || (*(long *)(pcVar1 + 8) != 0)) {
LAB_0012b1e6:
    lVar4 = 0;
  }
  else {
    uVar3 = (*(code *)**(undefined8 **)pcVar1)(pcVar1);
    if ((uVar3 >> 8 & 1) != 0) goto LAB_0012b1e6;
    lVar4 = mpt_buffer_insert(pcVar1,off,len);
  }
  if (lVar4 != 0) goto LAB_0012b239;
  plVar5 = (long *)_mpt_buffer_alloc(len + off);
  if (plVar5 == (long *)0x0) {
LAB_0012b233:
    lVar4 = 0;
    bVar2 = false;
  }
  else {
    plVar5[1] = 0;
    lVar4 = mpt_buffer_insert(plVar5,off,len);
    if (lVar4 == 0) {
      (**(code **)(*plVar5 + 8))(plVar5);
      goto LAB_0012b233;
    }
    bVar2 = true;
  }
  if (!bVar2) {
    return (void *)0x0;
  }
LAB_0012b239:
  if (data != (void *)0x0) {
    pvVar6 = memcpy((void *)(lVar4 + off),data,len);
    return pvVar6;
  }
  pvVar6 = memset((void *)(lVar4 + off),0,len);
  return pvVar6;
}

Assistant:

void *array::insert(size_t off, size_t len, const void *data)
{
	void *dest = 0;
	content *d;
	
	/* compatibility check */
	if ((d = _buf.instance())
	 && !d->content_traits()
	 && !d->shared()) {
		dest = d->insert(off, len);
	}
	if (!dest) {
		size_t total = off + len;
		if (!(d = static_cast<content *>(buffer::create(total)))) {
			return 0;
		}
		if (!(dest = d->insert(off, len))) {
			d->unref();
			return 0;
		}
	}
	dest = static_cast<uint8_t *>(dest) + off;
	if (data) {
		memcpy(dest, data, len);
	} else {
		memset(dest, 0, len);
	}
	return dest;
}